

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O2

mbedtls_mpi_uint
mbedtls_mpi_core_sub(mbedtls_mpi_uint *X,mbedtls_mpi_uint *A,mbedtls_mpi_uint *B,size_t limbs)

{
  size_t i;
  size_t sVar1;
  ulong uVar2;
  mbedtls_mpi_uint mVar3;
  
  mVar3 = 0;
  for (sVar1 = 0; limbs != sVar1; sVar1 = sVar1 + 1) {
    uVar2 = A[sVar1] - mVar3;
    mVar3 = (ulong)(uVar2 < B[sVar1]) + (ulong)(A[sVar1] < mVar3);
    X[sVar1] = uVar2 - B[sVar1];
  }
  return mVar3;
}

Assistant:

mbedtls_mpi_uint mbedtls_mpi_core_sub(mbedtls_mpi_uint *X,
                                      const mbedtls_mpi_uint *A,
                                      const mbedtls_mpi_uint *B,
                                      size_t limbs)
{
    mbedtls_mpi_uint c = 0;

    for (size_t i = 0; i < limbs; i++) {
        mbedtls_mpi_uint z = (A[i] < c);
        mbedtls_mpi_uint t = A[i] - c;
        c = (t < B[i]) + z;
        X[i] = t - B[i];
    }

    return c;
}